

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O1

void xmlXPtrRangeInsideFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectType xVar1;
  int *piVar2;
  int *piVar3;
  xmlGenericErrorFunc p_Var4;
  xmlElementType xVar5;
  xmlXPathObjectPtr pxVar6;
  xmlXPathObjectPtr obj;
  xmlLocationSetPtr cur;
  xmlGenericErrorFunc *pp_Var7;
  void **ppvVar8;
  _xmlNode *p_Var9;
  int iVar10;
  xmlNodePtr end;
  int startindex;
  xmlNodePtr cur_00;
  long lVar11;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    if (ctxt->valueFrame < ctxt->valueNr) {
      if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
         ((xVar1 = ctxt->value->type, xVar1 != XPATH_NODESET && (xVar1 != XPATH_LOCATIONSET)))) {
        iVar10 = 0xb;
      }
      else {
        pxVar6 = valuePop(ctxt);
        obj = pxVar6;
        if (pxVar6->type == XPATH_NODESET) {
          obj = xmlXPtrNewLocationSetNodeSet(pxVar6->nodesetval);
          xmlXPathFreeObject(pxVar6);
          if (obj == (xmlXPathObjectPtr)0x0) {
            xmlXPathErr(ctxt,0xf);
            return;
          }
        }
        cur = (xmlLocationSetPtr)(*xmlMalloc)(0x10);
        if (cur == (xmlLocationSetPtr)0x0) {
          xmlXPtrErrMemory("allocating locationset");
          cur = (xmlLocationSetPtr)0x0;
        }
        else {
          cur->locNr = 0;
          cur->locMax = 0;
          cur->locTab = (xmlXPathObjectPtr *)0x0;
        }
        if (cur != (xmlLocationSetPtr)0x0) {
          piVar2 = (int *)obj->user;
          if ((piVar2 != (int *)0x0) && (0 < *piVar2)) {
            lVar11 = 0;
            do {
              piVar3 = *(int **)(*(long *)(piVar2 + 2) + lVar11 * 8);
              if (((piVar3 == (int *)0x0) || (ctxt->context == (xmlXPathContextPtr)0x0)) ||
                 (ctxt->context->doc == (xmlDocPtr)0x0)) goto LAB_001ee43d;
              if (*piVar3 == 6) {
                cur_00 = *(xmlNodePtr *)(piVar3 + 10);
                end = *(xmlNodePtr *)(piVar3 + 0xe);
                if (end == (xmlNodePtr)0x0) {
                  xVar5 = cur_00->type;
                  if (XML_HTML_DOCUMENT_NODE < xVar5) goto LAB_001ee43d;
                  end = cur_00;
                  if ((0x3226U >> (xVar5 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)
                  goto LAB_001ee478;
                  iVar10 = xmlXPtrGetArity(cur_00);
LAB_001ee495:
                  startindex = 0;
                  cur_00 = end;
                }
                else {
                  startindex = piVar3[0xc];
                  iVar10 = piVar3[0x10];
                }
                goto LAB_001ee4d4;
              }
              if (*piVar3 == 5) {
                end = *(xmlNodePtr *)(piVar3 + 10);
                xVar5 = end->type;
                if (XML_HTML_DOCUMENT_NODE < xVar5) goto LAB_001ee43d;
                if ((0x3226U >> (xVar5 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
LAB_001ee478:
                  pxVar6 = (xmlXPathObjectPtr)0x0;
                  if ((0x198U >> (xVar5 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) {
                    if (end->content != (xmlChar *)0x0) {
                      iVar10 = xmlStrlen(end->content);
                      goto LAB_001ee495;
                    }
                    startindex = 0;
                    iVar10 = 0;
                    cur_00 = end;
                    goto LAB_001ee4d4;
                  }
                }
                else {
                  iVar10 = -1;
                  if (xVar5 != XML_NAMESPACE_DECL && end != (xmlNodePtr)0x0) {
                    iVar10 = 0;
                    for (p_Var9 = end->children; p_Var9 != (_xmlNode *)0x0; p_Var9 = p_Var9->next) {
                      if ((p_Var9->type < XML_DTD_NODE) &&
                         ((0x2202U >> (p_Var9->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) !=
                          0)) {
                        iVar10 = iVar10 + 1;
                      }
                    }
                  }
                  startindex = 0;
                  cur_00 = end;
LAB_001ee4d4:
                  pxVar6 = xmlXPtrNewRange(cur_00,startindex,end,iVar10);
                }
              }
              else {
                pp_Var7 = __xmlGenericError();
                p_Var4 = *pp_Var7;
                ppvVar8 = __xmlGenericErrorContext();
                (*p_Var4)(*ppvVar8,"Unimplemented block at %s:%d\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpointer.c"
                          ,0x868);
LAB_001ee43d:
                pxVar6 = (xmlXPathObjectPtr)0x0;
              }
              xmlXPtrLocationSetAdd(cur,pxVar6);
              lVar11 = lVar11 + 1;
            } while (lVar11 < *piVar2);
          }
          pxVar6 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
          if (pxVar6 == (xmlXPathObjectPtr)0x0) {
            xmlXPtrErrMemory("allocating locationset");
            pxVar6 = (xmlXPathObjectPtr)0x0;
          }
          else {
            *(undefined8 *)pxVar6 = 0;
            pxVar6->nodesetval = (xmlNodeSetPtr)0x0;
            pxVar6->stringval = (xmlChar *)0x0;
            pxVar6->user = (void *)0x0;
            *(undefined8 *)&pxVar6->index = 0;
            pxVar6->user2 = (void *)0x0;
            *(undefined8 *)&pxVar6->boolval = 0;
            pxVar6->floatval = 0.0;
            *(undefined8 *)&pxVar6->index2 = 0;
            pxVar6->type = XPATH_LOCATIONSET;
            pxVar6->user = cur;
          }
          valuePush(ctxt,pxVar6);
          xmlXPathFreeObject(obj);
          return;
        }
        xmlXPathFreeObject(obj);
        iVar10 = 0xf;
      }
    }
    else {
      iVar10 = 0x17;
    }
  }
  else {
    iVar10 = 0xc;
  }
  xmlXPathErr(ctxt,iVar10);
  return;
}

Assistant:

static void
xmlXPtrRangeInsideFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    int i;
    xmlXPathObjectPtr set;
    xmlLocationSetPtr oldset;
    xmlLocationSetPtr newset;

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_LOCATIONSET) &&
	 (ctxt->value->type != XPATH_NODESET)))
        XP_ERROR(XPATH_INVALID_TYPE)

    set = valuePop(ctxt);
    if (set->type == XPATH_NODESET) {
	xmlXPathObjectPtr tmp;

	/*
	 * First convert to a location set
	 */
	tmp = xmlXPtrNewLocationSetNodeSet(set->nodesetval);
	xmlXPathFreeObject(set);
	if (tmp == NULL)
	     XP_ERROR(XPATH_MEMORY_ERROR)
	set = tmp;
    }

    /*
     * The loop is to compute the covering range for each item and add it
     */
    newset = xmlXPtrLocationSetCreate(NULL);
    if (newset == NULL) {
	xmlXPathFreeObject(set);
        XP_ERROR(XPATH_MEMORY_ERROR);
    }
    oldset = (xmlLocationSetPtr) set->user;
    if (oldset != NULL) {
        for (i = 0;i < oldset->locNr;i++) {
            xmlXPtrLocationSetAdd(newset,
                    xmlXPtrInsideRange(ctxt, oldset->locTab[i]));
        }
    }

    /*
     * Save the new value and cleanup
     */
    valuePush(ctxt, xmlXPtrWrapLocationSet(newset));
    xmlXPathFreeObject(set);
}